

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

int grow_expansion(int elen,double *e,double b,double *h)

{
  ulong uVar1;
  double Q;
  double dVar2;
  
  if (elen < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    dVar2 = b;
    do {
      b = dVar2 + e[uVar1];
      h[uVar1] = (dVar2 - (b - (b - dVar2))) + (e[uVar1] - (b - dVar2));
      uVar1 = uVar1 + 1;
      dVar2 = b;
    } while ((uint)elen != uVar1);
  }
  h[uVar1 & 0xffffffff] = b;
  return (int)uVar1 + 1;
}

Assistant:

int grow_expansion(int elen, REAL *e, REAL b, REAL *h)
/* e and h can be the same. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int eindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = b;
  for (eindex = 0; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Sum(Q, enow, Qnew, h[eindex]);
    Q = Qnew;
  }
  h[eindex] = Q;
  return eindex + 1;
}